

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* GetOutputsNames_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,Net *net)

{
  long lVar1;
  ulong uVar2;
  vector<int,_std::allocator<int>_> outLayers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layersNames;
  void *local_48;
  void *local_40;
  long local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  if (GetOutputsNames[abi:cxx11](cv::dnn::dnn4_v20211004::Net_const&)::names_abi_cxx11_ == '\0') {
    GetOutputsNames_abi_cxx11_();
  }
  if (GetOutputsNames[abi:cxx11](cv::dnn::dnn4_v20211004::Net_const&)::names_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      GetOutputsNames[abi:cxx11](cv::dnn::dnn4_v20211004::Net_const&)::names_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    cv::dnn::dnn4_v20211004::Net::getUnconnectedOutLayers();
    cv::dnn::dnn4_v20211004::Net::getLayerNames_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&GetOutputsNames[abi:cxx11](cv::dnn::dnn4_v20211004::Net_const&)::names_abi_cxx11_,
             (long)local_40 - (long)local_48 >> 2);
    if (local_40 != local_48) {
      lVar1 = 0;
      uVar2 = 0;
      do {
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((long)&((GetOutputsNames[abi:cxx11](cv::dnn::dnn4_v20211004::Net_const&)::
                             names_abi_cxx11_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar1))
        ;
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x20;
      } while (uVar2 < (ulong)((long)local_40 - (long)local_48 >> 2));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_30);
    if (local_48 != (void *)0x0) {
      operator_delete(local_48,local_38 - (long)local_48);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,
           &GetOutputsNames[abi:cxx11](cv::dnn::dnn4_v20211004::Net_const&)::names_abi_cxx11_);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> GetOutputsNames(cv::dnn::Net const& net) noexcept {
  static std::vector<std::string> names;
  if (names.empty()) {
    //! Get the indices of the output layers, i.e. the layers with unconnected outputs
    std::vector<int> outLayers = net.getUnconnectedOutLayers();
    
    //! get the names of all the layers in the network
    std::vector<std::string> layersNames = net.getLayerNames();
    
    //! Get the names of the output layers in names
    names.resize(outLayers.size());
    
    for (size_t i = 0; i < outLayers.size(); ++i) {
      names[i] = layersNames[outLayers[i] - 1];
    }
  }
  return names;
}